

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.cpp
# Opt level: O1

int luaK_jump(FuncState *fs)

{
  int l2;
  int j;
  int local_1c;
  
  l2 = fs->jpc;
  fs->jpc = -1;
  local_1c = luaK_code(fs,0x7fff8017);
  luaK_concat(fs,&local_1c,l2);
  return local_1c;
}

Assistant:

int luaK_jump (FuncState *fs) {
  int jpc = fs->jpc;  /* save list of jumps to here */
  int j;
  fs->jpc = NO_JUMP;
  j = luaK_codeAsBx(fs, OP_JMP, 0, NO_JUMP);
  luaK_concat(fs, &j, jpc);  /* keep them on hold */
  return j;
}